

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::PushLocalVariable(SQFuncState *this,SQObject *name)

{
  SQInteger SVar1;
  SQUnsignedInteger SVar2;
  undefined1 local_48 [8];
  SQLocalVarInfo lvi;
  SQInteger pos;
  SQObject *name_local;
  SQFuncState *this_local;
  
  lvi._pos = sqvector<SQLocalVarInfo>::size(&this->_vlocals);
  SQLocalVarInfo::SQLocalVarInfo((SQLocalVarInfo *)local_48);
  ::SQObjectPtr::operator=((SQObjectPtr *)local_48,name);
  SVar1 = GetCurrentPos(this);
  lvi._name.super_SQObject._unVal.pTable = (SQTable *)(SVar1 + 1);
  lvi._end_op = sqvector<SQLocalVarInfo>::size(&this->_vlocals);
  sqvector<SQLocalVarInfo>::push_back(&this->_vlocals,(SQLocalVarInfo *)local_48);
  SVar2 = sqvector<SQLocalVarInfo>::size(&this->_vlocals);
  if ((ulong)this->_stacksize < SVar2) {
    SVar2 = sqvector<SQLocalVarInfo>::size(&this->_vlocals);
    this->_stacksize = SVar2;
  }
  SVar2 = lvi._pos;
  SQLocalVarInfo::~SQLocalVarInfo((SQLocalVarInfo *)local_48);
  return SVar2;
}

Assistant:

SQInteger SQFuncState::PushLocalVariable(const SQObject &name)
{
    SQInteger pos=_vlocals.size();
    SQLocalVarInfo lvi;
    lvi._name=name;
    lvi._start_op=GetCurrentPos()+1;
    lvi._pos=_vlocals.size();
    _vlocals.push_back(lvi);
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize))_stacksize=_vlocals.size();
    return pos;
}